

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::root_directory(path *this)

{
  bool bVar1;
  int iVar2;
  path *in_RDI;
  path *in_stack_ffffffffffffff98;
  allocator *in_stack_ffffffffffffffa0;
  string_type *in_stack_ffffffffffffffb8;
  path *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [48];
  
  bVar1 = has_root_directory(in_RDI);
  if (bVar1) {
    if (root_directory()::_root_dir == '\0') {
      iVar2 = __cxa_guard_acquire(&root_directory()::_root_dir);
      if (iVar2 != 0) {
        in_stack_ffffffffffffffa0 = &local_31;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_30,1,'/',in_stack_ffffffffffffffa0);
        path(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(format)((ulong)in_RDI >> 0x20));
        std::__cxx11::string::~string(local_30);
        std::allocator<char>::~allocator((allocator<char> *)&local_31);
        __cxa_atexit(~path,&root_directory::_root_dir,&__dso_handle);
        __cxa_guard_release(&root_directory()::_root_dir);
      }
    }
    path((path *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else {
    path((path *)0x131b55);
  }
  return in_RDI;
}

Assistant:

GHC_INLINE path path::root_directory() const
{
    if (has_root_directory()) {
        static const path _root_dir(std::string(1, preferred_separator), native_format);
        return _root_dir;
    }
    return path();
}